

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O2

int libcellml::convertPrefixToInt(string *in,bool *ok)

{
  bool bVar1;
  uint in_EAX;
  uint *puVar2;
  int prefixInt;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_EAX;
  if (ok != (bool *)0x0) {
    *ok = true;
  }
  bVar1 = isStandardPrefixName(in);
  if (bVar1) {
    puVar2 = (uint *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                           *)standardPrefixList_abi_cxx11_,in);
    uStack_18 = (ulong)*puVar2 << 0x20;
  }
  else if (in->_M_string_length != 0) {
    bVar1 = convertToInt(in,(int *)((long)&uStack_18 + 4));
    if (ok != (bool *)0x0) {
      *ok = bVar1;
    }
  }
  return uStack_18._4_4_;
}

Assistant:

int convertPrefixToInt(const std::string &in, bool *ok)
{
    int prefixInt = 0;

    if (ok != nullptr) {
        *ok = true;
    }

    if (isStandardPrefixName(in)) {
        prefixInt = standardPrefixList.at(in);
    } else if (!in.empty()) {
        bool success = convertToInt(in, prefixInt);
        if (ok != nullptr) {
            *ok = success;
        }
    }
    return prefixInt;
}